

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TextureBorderClampSamplingTexture<int,_int>::iterate
          (TextureBorderClampSamplingTexture<int,_int> *this)

{
  int *piVar1;
  GLenum GVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  GLint GVar7;
  undefined4 uVar8;
  GLint GVar9;
  undefined4 extraout_var;
  TestError *this_00;
  int *piVar11;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  byte bVar12;
  long lVar10;
  
  initTest(this);
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar10 + 0x1680))(this->m_po_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error using program!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x192);
  (**(code **)(lVar10 + 0x40))(0x8892,this->m_position_vbo_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x196);
  GVar7 = (**(code **)(lVar10 + 0x780))(this->m_po_id,"vertex_position_in");
  this->m_attr_position_location = GVar7;
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x199);
  (**(code **)(lVar10 + 0x19f0))(this->m_attr_position_location,4,0x1406,0,0,0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not set vertex attribute pointer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x19c);
  (**(code **)(lVar10 + 0x610))(this->m_attr_position_location);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not enable vertex attribute array!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x19f);
  (**(code **)(lVar10 + 0x40))(0x8892,this->m_text_coord_vbo_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a3);
  GVar7 = (**(code **)(lVar10 + 0x780))(this->m_po_id,"texture_coords_in");
  this->m_attr_texcoord_location = GVar7;
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a6);
  (**(code **)(lVar10 + 0x19f0))(this->m_attr_texcoord_location,2,0x1406,0,0,0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not set vertex attribute pointer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a9);
  (**(code **)(lVar10 + 0x610))(this->m_attr_texcoord_location);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not enable vertex attribute array!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1ac);
  (**(code **)(lVar10 + 8))(0x84c0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error setting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b0);
  (**(code **)(lVar10 + 0xb8))((this->m_test_configuration).m_target,this->m_input_to_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error binding texture!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b3);
  uVar8 = (**(code **)(lVar10 + 0xb48))(this->m_po_id,"test_sampler");
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Erros getting sampler location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b6);
  (**(code **)(lVar10 + 0x14f0))(uVar8,0);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not bind sampler location to texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b9);
  (**(code **)(lVar10 + 0xa8))(0,this->m_sampler_id);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Could not bind sampler object to texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1bc);
  GVar2 = (this->m_test_configuration).m_input_internal_format;
  if ((int)GVar2 < 0x8236) {
    if ((GVar2 == 0x8058) || (GVar2 == 0x81a5)) goto LAB_00cc9323;
    if (GVar2 != 0x8235) goto LAB_00cc973c;
    (**(code **)(lVar10 + 0x1260))
              (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR);
  }
  else {
    if ((int)GVar2 < 0x8cac) {
      if (GVar2 == 0x8236) {
        (**(code **)(lVar10 + 0x1268))
                  (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR)
        ;
        goto LAB_00cc934a;
      }
      if (GVar2 != 0x8814) goto LAB_00cc973c;
    }
    else if ((GVar2 != 0x9278) && (GVar2 != 0x8cac)) {
LAB_00cc973c:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported sized internal format. Should never happen!",
                 fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x1dc);
LAB_00cc9726:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
LAB_00cc9323:
    (**(code **)(lVar10 + 0x1278))
              (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR);
  }
LAB_00cc934a:
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error setting border color parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1df);
  (**(code **)(lVar10 + 0x1280))
            (this->m_sampler_id,0x2802,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error setting GL_TEXTURE_WRAP_S parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e3);
  (**(code **)(lVar10 + 0x1280))
            (this->m_sampler_id,0x8072,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error setting GL_TEXTURE_WRAP_R parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e5);
  (**(code **)(lVar10 + 0x1280))
            (this->m_sampler_id,0x2803,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error setting GL_TEXTURE_WRAP_T parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e7);
  (**(code **)(lVar10 + 0x1280))(this->m_sampler_id,0x2800,(this->m_test_configuration).m_filtering)
  ;
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error setting value for GL_TEXTURE_MAG_FILTER parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1eb);
  (**(code **)(lVar10 + 0x1280))(this->m_sampler_id,0x2801,(this->m_test_configuration).m_filtering)
  ;
  dVar6 = (**(code **)(lVar10 + 0x800))();
  glu::checkError(dVar6,"Error setting value for GL_TEXTURE_MIN_FILTER parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1ed);
  GVar7 = getStartingLayerIndex(this);
  GVar9 = getLastLayerIndex(this);
  if (GVar7 < GVar9) {
    piVar1 = &(this->m_test_configuration).m_expected_value;
    bVar12 = 1;
    do {
      uVar8 = (**(code **)(lVar10 + 0xb48))(this->m_po_id,"layer");
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Error getting layer uniform location!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,499);
      pcVar3 = *(code **)(lVar10 + 0x14e0);
      getCoordinateValue(this,GVar7);
      (*pcVar3)(uVar8);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Error setting layer uniform variable!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x1f6);
      (**(code **)(lVar10 + 0x78))(0x8ca9,this->m_fbo_id);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Error binding framebuffer object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x1fa);
      (**(code **)(lVar10 + 0x1a00))
                (0,0,(this->m_test_configuration).m_width,(this->m_test_configuration).m_height);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Error setting view port!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x201);
      (**(code **)(lVar10 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_output_to_id,0);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Could not attach texture object to GL_COLOR_ATTACHMENT0!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x209);
      checkFramebufferStatus(this,0x8ca9);
      (**(code **)(lVar10 + 0x188))(0x4000);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Error clearing color buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x210);
      (**(code **)(lVar10 + 0x538))(5,0,4);
      dVar6 = (**(code **)(lVar10 + 0x800))();
      glu::checkError(dVar6,"Rendering failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                      ,0x214);
      GVar2 = (this->m_test_configuration).m_target;
      piVar11 = piVar1;
      if ((GVar2 != 0xde1) && (GVar2 != 0x8c1a)) {
        if (GVar2 != 0x806f) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,
                     "Not allowed texture target - should be one of GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                     ,0x22a);
          goto LAB_00cc9726;
        }
        piVar11 = &(this->m_test_configuration).m_expected_value +
                  ((int)(this->m_test_configuration).m_depth <= GVar7 || GVar7 < 0);
      }
      bVar4 = checkResult(this,*piVar11,(this->m_test_configuration).m_expected_border_color,GVar7);
      bVar12 = bVar12 & bVar4;
      GVar7 = GVar7 + 1;
      GVar9 = getLastLayerIndex(this);
    } while (GVar7 < GVar9);
    if (bVar12 == 0) {
      this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00cc96b7;
    }
  }
  this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00cc96b7:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureBorderClampSamplingTexture<InputType, OutputType>::iterate(void)
{
	/* Initialize test case */
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program!");

	/* Configure vertices position attribute */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_position_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	m_attr_position_location = gl.getAttribLocation(m_po_id, "vertex_position_in");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");

	gl.vertexAttribPointer(m_attr_position_location, 4, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_attr_position_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Configure texture coordinates attribute */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_text_coord_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	m_attr_texcoord_location = gl.getAttribLocation(m_po_id, "texture_coords_in");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");

	gl.vertexAttribPointer(m_attr_texcoord_location, 2, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_attr_texcoord_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Configure and bind sampler to texture unit */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");

	gl.bindTexture(m_test_configuration.get_target(), m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture!");

	glw::GLint samplerLocation = gl.getUniformLocation(m_po_id, "test_sampler");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Erros getting sampler location!");

	gl.uniform1i(samplerLocation, m_texture_unit);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind sampler location to texture unit!");

	gl.bindSampler(m_texture_unit, m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind sampler object to texture unit!");

	/* Set GL_TEXTURE_BORDER_COLOR_EXT for sampler object */
	switch (m_test_configuration.get_input_internal_format())
	{
	case GL_RGBA32F:
	case GL_RGBA8:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH_COMPONENT16:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
	{
		glw::GLfloat val			= (glw::GLfloat)m_test_configuration.get_init_border_color();
		glw::GLfloat border_color[] = { val, val, val, val };
		gl.samplerParameterfv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}
	case GL_R32UI:
	{
		glw::GLuint val			   = (glw::GLuint)m_test_configuration.get_init_border_color();
		glw::GLuint border_color[] = { val, val, val, val };
		gl.samplerParameterIuiv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}
	case GL_R32I:
	{
		glw::GLint val			  = (glw::GLint)m_test_configuration.get_init_border_color();
		glw::GLint border_color[] = { val, val, val, val };
		gl.samplerParameterIiv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}

	default:
		throw tcu::TestError("Unsupported sized internal format. Should never happen!", "", __FILE__, __LINE__);
		break;
	};
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting border color parameter!");

	/* Set sampler's GL_TEXTURE_WRAP_* parameters values to GL_CLAMP_TO_BORDER_EXT */
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_S, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_S parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_R, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_R parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_T, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_T parameter!");

	/* Set GL_TEXTURE_MAG_FILTER and GL_TEXTURE_MIN_FILTER parameters values */
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_MAG_FILTER, m_test_configuration.get_filtering());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for GL_TEXTURE_MAG_FILTER parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_MIN_FILTER, m_test_configuration.get_filtering());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for GL_TEXTURE_MIN_FILTER parameter!");

	for (glw::GLint i = getStartingLayerIndex(); i < getLastLayerIndex(); ++i)
	{
		/* Configure layer (third texture coordinate) */
		glw::GLint layerLocation = gl.getUniformLocation(m_po_id, "layer");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting layer uniform location!");

		gl.uniform1f(layerLocation, getCoordinateValue(i));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting layer uniform variable!");

		/* Bind framebuffer object */
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object!");

		/* Set view port */
		gl.viewport(0,									/* x */
					0,									/* y */
					m_test_configuration.get_width(),   /* width */
					m_test_configuration.get_height()); /* height */
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting view port!");

		/* Attach texture to framebuffer */
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER,  /* target */
								GL_COLOR_ATTACHMENT0, /* attachment */
								GL_TEXTURE_2D,		  /* textarget */
								m_output_to_id,		  /* texture */
								0);					  /* level */
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach texture object to GL_COLOR_ATTACHMENT0!");

		/* Check framebuffer status */
		checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

		/* Clear the color buffer with (0.5, 0.5, 0.5, 1) color */
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error clearing color buffer");

		/* Render */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

		/* Get data from framebuffer's color attachment and compare with expected values.
		 * For GL_NEAREST filtering and GL_TEXTURE_3D texture target and Layer equal to
		 * -1 or Depth the whole texture is expected to be filled with border color
		 */
		OutputType expectedColor;

		switch (m_test_configuration.get_target())
		{
		case GL_TEXTURE_2D:
		case GL_TEXTURE_2D_ARRAY:
			expectedColor = m_test_configuration.get_expected_value();
			break;

		case GL_TEXTURE_3D:
			if (i > -1 && i < (glw::GLint)m_test_configuration.get_depth())
				expectedColor = m_test_configuration.get_expected_value();
			else
				expectedColor = m_test_configuration.get_expected_border_color();
			break;
		default:
			TCU_FAIL("Not allowed texture target - should be one of GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D");
		}

		if (!checkResult(expectedColor, m_test_configuration.get_expected_border_color(), i))
		{
			testResult = false;
		}
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	return STOP;
}